

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.hpp
# Opt level: O0

TerminalInfo * __thiscall
plot::TerminalInfo::query<void>(TerminalInfo *this,string_view cmd,string_view terminator)

{
  termios oldtermios;
  termios newtermios;
  undefined6 uVar1;
  bool bVar2;
  int iVar3;
  char *__buf;
  size_type sVar4;
  size_type sVar5;
  ssize_t sVar6;
  ulong uVar7;
  size_type sVar8;
  size_t sVar9;
  char local_1f9;
  string local_1f8 [7];
  char ch;
  string result;
  int local_1d4;
  milliseconds mStack_1d0;
  int available;
  undefined4 local_1c8;
  undefined1 local_1b8 [32];
  cc_t acStack_198 [32];
  undefined1 local_178 [32];
  cc_t acStack_158 [32];
  undefined1 local_138 [8];
  tcsetattr_guard guard;
  termios newAttrs;
  undefined1 auStack_74 [8];
  termios oldAttrs;
  TerminalInfo *this_local;
  string_view terminator_local;
  string_view cmd_local;
  
  this_local = (TerminalInfo *)terminator._M_str;
  terminator_local._M_str = cmd._M_str;
  sVar9 = cmd._M_len;
  oldAttrs._52_8_ = sVar9;
  iVar3 = tcgetattr(*(int *)(sVar9 + 0x24),(termios *)auStack_74);
  if (iVar3 == 0) {
    guard.new_.c_ispeed = auStack_74._0_4_;
    guard.new_.c_ospeed = auStack_74._4_4_;
    newAttrs._0_8_ = oldAttrs._0_8_ & 0xfffffff5ffffffff;
    uVar1 = oldAttrs._8_6_;
    newAttrs._8_8_ = oldAttrs._8_8_ & 0xffffffffffff;
    acStack_158[0x14] = oldAttrs.c_cc[0x1b];
    acStack_158[0x15] = oldAttrs.c_cc[0x1c];
    acStack_158[0x16] = oldAttrs.c_cc[0x1d];
    acStack_158[0x17] = oldAttrs.c_cc[0x1e];
    acStack_158[0x18] = oldAttrs.c_cc[0x1f];
    acStack_158[0x19] = oldAttrs._49_1_;
    acStack_158[0x1a] = oldAttrs._50_1_;
    acStack_158[0x1b] = oldAttrs._51_1_;
    acStack_158[0] = oldAttrs.c_cc[7];
    acStack_158[1] = oldAttrs.c_cc[8];
    acStack_158[2] = oldAttrs.c_cc[9];
    acStack_158[3] = oldAttrs.c_cc[10];
    acStack_158[4] = oldAttrs.c_cc[0xb];
    acStack_158[5] = oldAttrs.c_cc[0xc];
    acStack_158[6] = oldAttrs.c_cc[0xd];
    acStack_158[7] = oldAttrs.c_cc[0xe];
    local_178._16_4_ = oldAttrs.c_cflag;
    local_178._20_4_ = oldAttrs.c_lflag;
    local_178[0x18] = oldAttrs.c_line;
    local_178[0x19] = oldAttrs.c_cc[0];
    local_178[0x1a] = oldAttrs.c_cc[1];
    local_178[0x1b] = oldAttrs.c_cc[2];
    local_178[0x1c] = oldAttrs.c_cc[3];
    local_178[0x1d] = oldAttrs.c_cc[4];
    local_178[0x1e] = oldAttrs.c_cc[5];
    local_178[0x1f] = oldAttrs.c_cc[6];
    local_178._0_8_ = auStack_74;
    local_178._8_4_ = oldAttrs.c_iflag;
    local_178._12_4_ = oldAttrs.c_oflag;
    acStack_198[0x14] = oldAttrs.c_cc[0x1b];
    acStack_198[0x15] = oldAttrs.c_cc[0x1c];
    acStack_198[0x16] = oldAttrs.c_cc[0x1d];
    acStack_198[0x17] = oldAttrs.c_cc[0x1e];
    acStack_198[0x18] = oldAttrs.c_cc[0x1f];
    acStack_198[0x19] = oldAttrs._49_1_;
    acStack_198[0x1a] = oldAttrs._50_1_;
    acStack_198[0x1b] = oldAttrs._51_1_;
    acStack_198[0] = oldAttrs.c_cc[7];
    acStack_198[1] = oldAttrs.c_cc[8];
    acStack_198[2] = oldAttrs.c_cc[9];
    acStack_198[3] = oldAttrs.c_cc[10];
    acStack_198[4] = oldAttrs.c_cc[0xb];
    acStack_198[5] = oldAttrs.c_cc[0xc];
    acStack_198[6] = oldAttrs.c_cc[0xd];
    acStack_198[7] = oldAttrs.c_cc[0xe];
    local_1b8._16_4_ = newAttrs.c_cflag;
    local_1b8._20_4_ = newAttrs.c_lflag;
    local_1b8[0x18] = oldAttrs.c_line;
    local_1b8[0x19] = oldAttrs.c_cc[0];
    local_1b8[0x1a] = oldAttrs.c_cc[1];
    local_1b8[0x1b] = oldAttrs.c_cc[2];
    local_1b8[0x1c] = oldAttrs.c_cc[3];
    local_1b8[0x1d] = oldAttrs.c_cc[4];
    local_1b8[0x1e] = oldAttrs.c_cc[5];
    local_1b8[0x1f] = oldAttrs.c_cc[6];
    local_1b8._0_8_ = auStack_74;
    local_1b8._8_4_ = newAttrs.c_iflag;
    local_1b8._12_4_ = newAttrs.c_oflag;
    oldtermios.c_cflag = oldAttrs.c_iflag;
    oldtermios.c_lflag = oldAttrs.c_oflag;
    oldtermios.c_iflag = auStack_74._0_4_;
    oldtermios.c_oflag = auStack_74._4_4_;
    oldtermios._16_8_ = oldAttrs._8_8_;
    oldtermios.c_cc[7] = oldAttrs.c_line;
    oldtermios.c_cc[8] = oldAttrs.c_cc[0];
    oldtermios.c_cc[9] = oldAttrs.c_cc[1];
    oldtermios.c_cc[10] = oldAttrs.c_cc[2];
    oldtermios.c_cc[0xb] = oldAttrs.c_cc[3];
    oldtermios.c_cc[0xc] = oldAttrs.c_cc[4];
    oldtermios.c_cc[0xd] = oldAttrs.c_cc[5];
    oldtermios.c_cc[0xe] = oldAttrs.c_cc[6];
    oldtermios.c_cc[0xf] = oldAttrs.c_cc[7];
    oldtermios.c_cc[0x10] = oldAttrs.c_cc[8];
    oldtermios.c_cc[0x11] = oldAttrs.c_cc[9];
    oldtermios.c_cc[0x12] = oldAttrs.c_cc[10];
    oldtermios.c_cc[0x13] = oldAttrs.c_cc[0xb];
    oldtermios.c_cc[0x14] = oldAttrs.c_cc[0xc];
    oldtermios.c_cc[0x15] = oldAttrs.c_cc[0xd];
    oldtermios.c_cc[0x16] = oldAttrs.c_cc[0xe];
    oldtermios.c_cc[0x17] = oldAttrs.c_cc[0xf];
    oldtermios.c_cc[0x18] = oldAttrs.c_cc[0x10];
    oldtermios.c_cc[0x19] = oldAttrs.c_cc[0x11];
    oldtermios.c_cc[0x1a] = oldAttrs.c_cc[0x12];
    oldtermios.c_cc[0x1b] = oldAttrs.c_cc[0x13];
    oldtermios.c_cc[0x1c] = oldAttrs.c_cc[0x14];
    oldtermios.c_cc[0x1d] = oldAttrs.c_cc[0x15];
    oldtermios.c_cc[0x1e] = oldAttrs.c_cc[0x16];
    oldtermios.c_cc[0x1f] = oldAttrs.c_cc[0x17];
    oldtermios._49_1_ = oldAttrs.c_cc[0x18];
    oldtermios._50_1_ = oldAttrs.c_cc[0x19];
    oldtermios._51_1_ = oldAttrs.c_cc[0x1a];
    oldtermios._52_8_ = oldAttrs._44_8_;
    newtermios.c_cflag = newAttrs.c_iflag;
    newtermios.c_lflag = newAttrs.c_oflag;
    newtermios.c_iflag = auStack_74._0_4_;
    newtermios.c_oflag = auStack_74._4_4_;
    newtermios.c_line = (char)uVar1;
    newtermios.c_cc[0] = (char)((uint6)uVar1 >> 8);
    newtermios.c_cc[1] = (char)((uint6)uVar1 >> 0x10);
    newtermios.c_cc[2] = (char)((uint6)uVar1 >> 0x18);
    newtermios.c_cc[3] = (char)((uint6)uVar1 >> 0x20);
    newtermios.c_cc[4] = (char)((uint6)uVar1 >> 0x28);
    newtermios.c_cc[5] = '\0';
    newtermios.c_cc[6] = '\0';
    newtermios.c_cc[7] = oldAttrs.c_line;
    newtermios.c_cc[8] = oldAttrs.c_cc[0];
    newtermios.c_cc[9] = oldAttrs.c_cc[1];
    newtermios.c_cc[10] = oldAttrs.c_cc[2];
    newtermios.c_cc[0xb] = oldAttrs.c_cc[3];
    newtermios.c_cc[0xc] = oldAttrs.c_cc[4];
    newtermios.c_cc[0xd] = oldAttrs.c_cc[5];
    newtermios.c_cc[0xe] = oldAttrs.c_cc[6];
    newtermios.c_cc[0xf] = oldAttrs.c_cc[7];
    newtermios.c_cc[0x10] = oldAttrs.c_cc[8];
    newtermios.c_cc[0x11] = oldAttrs.c_cc[9];
    newtermios.c_cc[0x12] = oldAttrs.c_cc[10];
    newtermios.c_cc[0x13] = oldAttrs.c_cc[0xb];
    newtermios.c_cc[0x14] = oldAttrs.c_cc[0xc];
    newtermios.c_cc[0x15] = oldAttrs.c_cc[0xd];
    newtermios.c_cc[0x16] = oldAttrs.c_cc[0xe];
    newtermios.c_cc[0x17] = oldAttrs.c_cc[0xf];
    newtermios.c_cc[0x18] = oldAttrs.c_cc[0x10];
    newtermios.c_cc[0x19] = oldAttrs.c_cc[0x11];
    newtermios.c_cc[0x1a] = oldAttrs.c_cc[0x12];
    newtermios.c_cc[0x1b] = oldAttrs.c_cc[0x13];
    newtermios.c_cc[0x1c] = oldAttrs.c_cc[0x14];
    newtermios.c_cc[0x1d] = oldAttrs.c_cc[0x15];
    newtermios.c_cc[0x1e] = oldAttrs.c_cc[0x16];
    newtermios.c_cc[0x1f] = oldAttrs.c_cc[0x17];
    newtermios._49_1_ = oldAttrs.c_cc[0x18];
    newtermios._50_1_ = oldAttrs.c_cc[0x19];
    newtermios._51_1_ = oldAttrs.c_cc[0x1a];
    newtermios._52_8_ = oldAttrs._44_8_;
    detail::tcsetattr_guard::tcsetattr_guard
              ((tcsetattr_guard *)local_138,*(Terminal *)(sVar9 + 0x24),oldtermios,newtermios);
    bVar2 = detail::tcsetattr_guard::set((tcsetattr_guard *)local_138);
    if (bVar2) {
      iVar3 = tcdrain(*(int *)(sVar9 + 0x24));
      if (iVar3 == 0) {
        iVar3 = tcflush(*(int *)(sVar9 + 0x24),0);
        if (iVar3 == 0) {
          iVar3 = *(int *)(sVar9 + 0x24);
          __buf = std::experimental::fundamentals_v1::
                  basic_string_view<char,_std::char_traits<char>_>::data
                            ((basic_string_view<char,_std::char_traits<char>_> *)
                             &terminator_local._M_str);
          sVar4 = std::experimental::fundamentals_v1::
                  basic_string_view<char,_std::char_traits<char>_>::size
                            ((basic_string_view<char,_std::char_traits<char>_> *)
                             &terminator_local._M_str);
          sVar4 = write(iVar3,__buf,sVar4);
          sVar5 = std::experimental::fundamentals_v1::
                  basic_string_view<char,_std::char_traits<char>_>::size
                            ((basic_string_view<char,_std::char_traits<char>_> *)
                             &terminator_local._M_str);
          if (sVar4 == sVar5) {
            mStack_1d0 = ms<(char)49,(char)48,(char)48>();
            std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&stack0xfffffffffffffe30);
            local_1d4 = 0;
            iVar3 = ioctl(*(int *)(sVar9 + 0x24),0x541b,&local_1d4);
            if (iVar3 == 0) {
              std::__cxx11::string::string(local_1f8);
              do {
                if (local_1d4 == 0) {
                  std::__cxx11::string::string((string *)this);
                  goto LAB_0011373d;
                }
                std::__cxx11::string::size();
                std::__cxx11::string::reserve((ulong)local_1f8);
                for (; 0 < local_1d4; local_1d4 = local_1d4 + -1) {
                  local_1f9 = '\0';
                  sVar6 = read(*(int *)(sVar9 + 0x24),&local_1f9,1);
                  if (sVar6 != 1) {
                    std::__cxx11::string::string((string *)this);
                    goto LAB_0011373d;
                  }
                  uVar7 = std::__cxx11::string::empty();
                  if (((uVar7 & 1) == 0) || (local_1f9 == '\x1b')) {
                    std::__cxx11::string::append((ulong)local_1f8,'\x01');
                    sVar8 = std::experimental::fundamentals_v1::
                            basic_string_view<char,_std::char_traits<char>_>::find
                                      ((basic_string_view<char,_std::char_traits<char>_> *)
                                       &this_local,local_1f9,0);
                    if (sVar8 != 0xffffffffffffffff) {
                      std::__cxx11::string::string((string *)this,local_1f8);
                      goto LAB_0011373d;
                    }
                  }
                }
                uVar7 = std::__cxx11::string::empty();
              } while (((uVar7 & 1) != 0) ||
                      (iVar3 = ioctl(*(int *)(sVar9 + 0x24),0x541b,&local_1d4), iVar3 == 0));
              std::__cxx11::string::string((string *)this);
LAB_0011373d:
              local_1c8 = 1;
              std::__cxx11::string::~string(local_1f8);
            }
            else {
              std::__cxx11::string::string((string *)this);
              local_1c8 = 1;
            }
          }
          else {
            std::__cxx11::string::string((string *)this);
            local_1c8 = 1;
          }
        }
        else {
          std::__cxx11::string::string((string *)this);
          local_1c8 = 1;
        }
      }
      else {
        std::__cxx11::string::string((string *)this);
        local_1c8 = 1;
      }
    }
    else {
      std::__cxx11::string::string((string *)this);
      local_1c8 = 1;
    }
    detail::tcsetattr_guard::~tcsetattr_guard((tcsetattr_guard *)local_138);
  }
  else {
    std::__cxx11::string::string((string *)this);
  }
  return this;
}

Assistant:

std::string TerminalInfo::query(string_view cmd, string_view terminator) {
    struct termios oldAttrs;
    if (tcgetattr(term_, &oldAttrs))
        return std::string();

    struct termios newAttrs = oldAttrs;
    newAttrs.c_lflag &= ~(ECHO | ICANON);
    newAttrs.c_cc[VMIN] = 0;
    newAttrs.c_cc[VTIME] = 0;

    detail::tcsetattr_guard guard(term_, oldAttrs, newAttrs);
    if (!guard.set())
        return std::string();

    if (tcdrain(term_))
        return std::string();

    if (tcflush(term_, TCIFLUSH))
        return std::string();

    if (std::size_t(write(term_, cmd.data(), cmd.size())) != cmd.size())
        return std::string();

    // FIXME: This won't be enough for remote terminals (e.g. SSH)
    using namespace std::chrono_literals;
    std::this_thread::sleep_for(100ms);

    int available = 0;
    if (ioctl(term_, FIONREAD, &available))
        return std::string();

    std::string result;

    while (available) {
        result.reserve(result.size() + available);

        for (; available > 0; --available) {
            char ch = '\0';
            if (read(term_, &ch, 1) != 1)
                return std::string();

            if (!result.empty() || ch == '\x1b') {
                result.append(1, ch);
                if (terminator.find(ch) != string_view::npos)
                    return result;
            }
        }

        // If we found an escape character but no terminator, continue reading
        if (!result.empty())
            if (ioctl(term_, FIONREAD, &available))
                return std::string();
    }

    return std::string();
}